

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O3

void __thiscall adios2::helper::CommImplMPI::Free(CommImplMPI *this,string *hint)

{
  int value;
  MPI_Comm mpiComm;
  MPI_Comm local_10;
  
  local_10 = this->m_MPIComm;
  if (((local_10 != (MPI_Comm)&ompi_mpi_comm_self) && (local_10 != (MPI_Comm)&ompi_mpi_comm_null))
     && (local_10 != (MPI_Comm)&ompi_mpi_comm_world)) {
    this->m_MPIComm = (MPI_Comm)&ompi_mpi_comm_null;
    value = MPI_Comm_free(&local_10);
    anon_unknown_1::CheckMPIReturn(value,hint);
  }
  return;
}

Assistant:

void CommImplMPI::Free(const std::string &hint)
{
    if (m_MPIComm != MPI_COMM_NULL && m_MPIComm != MPI_COMM_WORLD && m_MPIComm != MPI_COMM_SELF)
    {
        MPI_Comm mpiComm = m_MPIComm;
        m_MPIComm = MPI_COMM_NULL; // prevent freeing a second time
        CheckMPIReturn(MPI_Comm_free(&mpiComm), hint);
    }
}